

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O3

cl_int clEnqueueMigrateMemINTEL
                 (cl_command_queue queue,void *ptr,size_t size,cl_mem_migration_flags flags,
                 cl_uint num_events_in_wait_list,cl_event *event_wait_list,cl_event *event)

{
  _Rb_tree_header *p_Var1;
  CTracker *pCVar2;
  cl_device_id p_Var3;
  CLIntercept *this;
  cl_mem_migration_flags cVar4;
  byte bVar5;
  cl_int errorCode;
  int iVar6;
  cl_int errorCode_00;
  mapped_type *pmVar7;
  uint64_t enqueueCounter;
  time_point tVar8;
  time_point tVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  cl_platform_id platform;
  cl_device_id device;
  cl_event local_event;
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  cl_mem_migration_flags local_68;
  time_point local_60;
  time_point local_58;
  undefined8 local_50;
  void *local_48;
  size_t local_40;
  cl_event local_38;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x24;
  }
  local_88._0_8_ = (cl_device_id)0x0;
  local_68 = flags;
  local_48 = ptr;
  local_40 = size;
  (*(g_pIntercept->m_Dispatch).clGetCommandQueueInfo)(queue,0x1091,8,local_88,(size_t *)0x0);
  local_a8._0_8_ = (key_type)0x0;
  (*(this->m_Dispatch).clGetDeviceInfo)
            ((cl_device_id)local_88._0_8_,0x1031,8,local_a8,(size_t *)0x0);
  p_Var10 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var10 == (_Base_ptr)0x0) {
LAB_0013d4ea:
    local_a8._0_8_ = (key_type)0x0;
    pmVar7 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,(key_type *)local_a8);
  }
  else {
    p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
    p_Var11 = &p_Var1->_M_header;
    do {
      if (*(key_type *)(p_Var10 + 1) >= (ulong)local_a8._0_8_) {
        p_Var11 = p_Var10;
      }
      p_Var10 = (&p_Var10->_M_left)[*(key_type *)(p_Var10 + 1) < (ulong)local_a8._0_8_];
    } while (p_Var10 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var11 == p_Var1) ||
       ((ulong)local_a8._0_8_ < *(key_type *)(p_Var11 + 1))) goto LAB_0013d4ea;
    pmVar7 = (mapped_type *)&p_Var11[1]._M_parent;
  }
  if (pmVar7->clEnqueueMigrateMemINTEL ==
      (_func_cl_int_cl_command_queue_void_ptr_size_t_cl_mem_migration_flags_cl_uint_cl_event_ptr_cl_event_ptr
       *)0x0) {
    return -0x24;
  }
  enqueueCounter = CLIntercept::incrementEnqueueCounter(this);
  if (((((this->m_Config).AubCapture == true) &&
       ((this->m_Config).AubCaptureMinEnqueue <= enqueueCounter)) &&
      (enqueueCounter <= (this->m_Config).AubCaptureMaxEnqueue)) &&
     ((this->m_Config).AubCaptureIndividualEnqueues == false)) {
    CLIntercept::startAubCapture
              (this,"clEnqueueMigrateMemINTEL",enqueueCounter,(cl_kernel)0x0,0,(size_t *)0x0,
               (size_t *)0x0,queue);
  }
  errorCode = 0;
  if ((this->m_Config).NullEnqueue != false) goto LAB_0013da2b;
  getFormattedEventWaitList_abi_cxx11_
            ((string *)local_a8,this,num_events_in_wait_list,event_wait_list);
  cVar4 = local_68;
  if ((this->m_Config).CallLogging == true) {
    CEnumNameMap::name_mem_migration_flags_abi_cxx11_
              ((string *)local_88,&this->m_EnumNameMap,local_68);
    CLIntercept::callLoggingEnter
              (this,"clEnqueueMigrateMemINTEL",enqueueCounter,(cl_kernel)0x0,
               "queue = %p, ptr = %p, size = %zu, flags = %s (%llX)%s",queue,local_48,local_40,
               local_88._0_8_,cVar4,local_a8._0_8_);
    if ((cl_device_id)local_88._0_8_ != (cl_device_id)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_);
    }
  }
  if ((this->m_Config).EventChecking == true) {
    CLIntercept::checkEventList
              (this,"clEnqueueMigrateMemINTEL",num_events_in_wait_list,event_wait_list,event);
  }
  local_38 = (cl_event)0x0;
  if ((((this->m_Config).DevicePerformanceTiming == false) &&
      ((this->m_Config).ITTPerformanceTiming == false)) &&
     (((this->m_Config).ChromePerformanceTiming == false &&
      ((this->m_Config).DevicePerfCounterEventBasedSampling != true)))) {
    local_58.__d.__r = (duration)0;
    local_50 = 0;
  }
  else {
    local_58.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_50 = CONCAT71((int7)((ulong)local_58.__d.__r >> 8),event == (cl_event *)0x0);
    if (event == (cl_event *)0x0) {
      event = &local_38;
    }
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_60.__d.__r = (duration)0;
  }
  else {
    local_60.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode = (*pmVar7->clEnqueueMigrateMemINTEL)
                        (queue,local_48,local_40,local_68,num_events_in_wait_list,event_wait_list,
                         event);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    tVar8.__d.__r = (duration)0;
  }
  else {
    tVar8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
        (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      local_88._0_8_ = (cl_device_id)(local_88 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"");
      CLIntercept::updateHostTimingStats
                (this,"clEnqueueMigrateMemINTEL",(string *)local_88,local_60,tVar8);
      if ((cl_device_id)local_88._0_8_ != (cl_device_id)(local_88 + 0x10)) {
        operator_delete((void *)local_88._0_8_);
      }
    }
  }
  if ((((this->m_Config).DevicePerformanceTiming == false) &&
      ((this->m_Config).ITTPerformanceTiming == false)) &&
     ((this->m_Config).ChromePerformanceTiming == false)) {
    if ((event != (cl_event *)0x0) &&
       ((this->m_Config).DevicePerfCounterEventBasedSampling != false)) {
LAB_0013d7e5:
      if (((this->m_Config).DevicePerformanceTimingMinEnqueue <= enqueueCounter) &&
         (enqueueCounter <= (this->m_Config).DevicePerformanceTimingMaxEnqueue)) {
        p_Var3 = (cl_device_id)(local_88 + 0x10);
        if ((this->m_Config).DevicePerformanceTimingSkipUnmap == true) {
          local_88._0_8_ = p_Var3;
          local_68 = (cl_mem_migration_flags)tVar8.__d.__r;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_88,"clEnqueueMigrateMemINTEL","");
          iVar6 = std::__cxx11::string::compare(local_88);
          if ((cl_device_id)local_88._0_8_ != p_Var3) {
            operator_delete((void *)local_88._0_8_);
          }
          tVar8.__d.__r = (duration)(duration)local_68;
          if (iVar6 == 0) goto LAB_0013d8c4;
        }
        local_88._0_8_ = p_Var3;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"");
        CLIntercept::addTimingEvent
                  (this,"clEnqueueMigrateMemINTEL",enqueueCounter,local_58,(string *)local_88,queue,
                   *event);
        if ((cl_device_id)local_88._0_8_ != p_Var3) {
          operator_delete((void *)local_88._0_8_);
        }
      }
LAB_0013d8c4:
      if ((char)local_50 != '\0') {
        (*(this->m_Dispatch).clReleaseEvent)(*event);
        goto LAB_0013d8d9;
      }
    }
  }
  else {
    if (event != (cl_event *)0x0) goto LAB_0013d7e5;
LAB_0013d8d9:
    event = (cl_event *)0x0;
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar5 = (this->m_Config).ErrorAssert;
    if ((bool)bVar5 == false) {
      if ((errorCode == 0) || ((this->m_Config).NoErrors == false)) goto LAB_0013d945;
    }
    else if (errorCode == 0) goto LAB_0013d918;
LAB_0013d92a:
    if ((bVar5 & 1) != 0) {
      raise(5);
    }
    if ((this->m_Config).NoErrors != false) {
      errorCode = 0;
    }
  }
  else {
    if (errorCode != 0) {
      CLIntercept::logError(this,"clEnqueueMigrateMemINTEL",errorCode);
      bVar5 = (this->m_Config).ErrorAssert;
      goto LAB_0013d92a;
    }
LAB_0013d918:
    errorCode = 0;
  }
LAB_0013d945:
  if (((event != (cl_event *)0x0) && ((this->m_Config).LeakChecking != false)) &&
     (*event != (cl_event)0x0)) {
    LOCK();
    pCVar2 = &(this->m_ObjectTracker).m_Events;
    (pCVar2->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar2->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clEnqueueMigrateMemINTEL",errorCode,event,(cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    local_88._0_8_ = (cl_device_id)(local_88 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"");
    CLIntercept::chromeCallLoggingExit
              (this,"clEnqueueMigrateMemINTEL",(string *)local_88,true,enqueueCounter,local_60,tVar8
              );
    if ((cl_device_id)local_88._0_8_ != (cl_device_id)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_);
    }
  }
  if (((event != (cl_event *)0x0) && (*event != (cl_event)0x0)) &&
     (((this->m_Config).ChromeCallLogging != false ||
      ((this->m_Config).ChromePerformanceTiming == true)))) {
    CLIntercept::addEvent(this,*event,enqueueCounter);
  }
  if ((key_type)local_a8._0_8_ != (key_type)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_);
  }
LAB_0013da2b:
  if ((this->m_Config).FinishAfterEnqueue == true) {
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar8.__d.__r = (duration)0;
    }
    CLIntercept::logFlushOrFinishAfterEnqueueStart(this,"clFinish","clEnqueueMigrateMemINTEL");
    errorCode_00 = (*(this->m_Dispatch).clFinish)(queue);
    CLIntercept::logFlushOrFinishAfterEnqueueEnd
              (this,"clFinish","clEnqueueMigrateMemINTEL",errorCode_00);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar9.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
          (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        local_a8._0_8_ = (key_type)(local_a8 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
        CLIntercept::updateHostTimingStats
                  (this,"(finish after enqueue)",(string *)local_a8,tVar8,tVar9);
        if ((key_type)local_a8._0_8_ != (key_type)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_);
        }
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        local_a8._0_8_ = (key_type)(local_a8 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
        CLIntercept::chromeCallLoggingExit
                  (this,"(finish after enqueue)",(string *)local_a8,false,0,tVar8,tVar9);
        if ((key_type)local_a8._0_8_ != (key_type)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_);
        }
      }
    }
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar8.__d.__r = (duration)0;
    }
    CLIntercept::checkTimingEvents(this);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar9.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
          (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        local_a8._0_8_ = (key_type)(local_a8 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
        CLIntercept::updateHostTimingStats
                  (this,"(device timing overhead)",(string *)local_a8,tVar8,tVar9);
        if ((key_type)local_a8._0_8_ != (key_type)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_);
        }
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        local_a8._0_8_ = (key_type)(local_a8 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
        CLIntercept::chromeCallLoggingExit
                  (this,"(device timing overhead)",(string *)local_a8,false,0,tVar8,tVar9);
        if ((key_type)local_a8._0_8_ != (key_type)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_);
        }
      }
    }
  }
  else if ((this->m_Config).FlushAfterEnqueue == true) {
    (*(this->m_Dispatch).clFlush)(queue);
  }
  if (((this->m_Config).AubCapture == true) &&
     ((((this->m_Config).AubCaptureIndividualEnqueues != false ||
       (enqueueCounter < (this->m_Config).AubCaptureMinEnqueue)) ||
      ((this->m_Config).AubCaptureMaxEnqueue < enqueueCounter)))) {
    CLIntercept::stopAubCapture(this,queue);
  }
  return errorCode;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clEnqueueMigrateMemINTEL(
    cl_command_queue queue,
    const void* ptr,
    size_t size,
    cl_mem_migration_flags flags,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(queue);
        if( dispatchX.clEnqueueMigrateMemINTEL )
        {
            cl_int  retVal = CL_SUCCESS;

            INCREMENT_ENQUEUE_COUNTER();
            CHECK_AUBCAPTURE_START( queue );

            if( pIntercept->config().NullEnqueue == false )
            {
                const std::string eventWaitListString = getFormattedEventWaitList(
                    pIntercept,
                    num_events_in_wait_list,
                    event_wait_list);

                CALL_LOGGING_ENTER( "queue = %p, ptr = %p, size = %zu, flags = %s (%llX)%s",
                    queue,
                    ptr,
                    size,
                    pIntercept->enumName().name_mem_migration_flags( flags ).c_str(),
                    flags,
                    eventWaitListString.c_str() );
                CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
                DEVICE_PERFORMANCE_TIMING_START( event );
                HOST_PERFORMANCE_TIMING_START();

                retVal = dispatchX.clEnqueueMigrateMemINTEL(
                    queue,
                    ptr,
                    size,
                    flags,
                    num_events_in_wait_list,
                    event_wait_list,
                    event );

                HOST_PERFORMANCE_TIMING_END();
                DEVICE_PERFORMANCE_TIMING_END( queue, event );
                CHECK_ERROR( retVal );
                ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
                CALL_LOGGING_EXIT_EVENT( retVal, event );
                ADD_EVENT( event ? event[0] : NULL );
            }

            FINISH_OR_FLUSH_AFTER_ENQUEUE( queue );
            CHECK_AUBCAPTURE_STOP( queue );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_QUEUE);
}